

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

unique_ptr<Catch::CompactReporter> __thiscall
Catch::Detail::make_unique<Catch::CompactReporter,Catch::ReporterConfig>
          (Detail *this,ReporterConfig *args)

{
  ReporterBase *this_00;
  
  this_00 = (ReporterBase *)operator_new(0x90);
  ReporterBase::ReporterBase(this_00,args);
  this_00[1].super_IEventListener._vptr_IEventListener =
       (_func_int **)"test run has not started yet";
  *(undefined8 *)&this_00[1].super_IEventListener.m_preferences = 0x1c;
  this_00[1].super_IEventListener.m_config = (IConfig *)0x0;
  this_00[1].m_wrapped_stream.m_ptr = (IStream *)0x0;
  this_00[1].m_stream = (ostream *)0x0;
  this_00[1].m_colour.m_ptr = (ColourImpl *)0x0;
  (this_00->super_IEventListener)._vptr_IEventListener =
       (_func_int **)&PTR__CompactReporter_00322e00;
  *(ReporterBase **)this = this_00;
  return (unique_ptr<Catch::CompactReporter>)(CompactReporter *)this;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        return unique_ptr<T>(new T(CATCH_FORWARD(args)...));
    }